

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O1

void __thiscall
TPZDohrSubstruct<std::complex<double>_>::Contribute_v2
          (TPZDohrSubstruct<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *v2)

{
  complex<double> *pcVar1;
  int iVar2;
  pair<int,_int> *ppVar3;
  double dVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  complex<double> *pcVar8;
  ulong uVar9;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  
  SolveSystemZi(this);
  uVar5 = (uint)(this->fGlobalEqs).fNElements;
  if (0 < (int)uVar5) {
    uVar9 = 0;
    do {
      ppVar3 = (this->fGlobalEqs).fStore;
      lVar6 = (long)ppVar3[uVar9].first;
      pcVar8 = (this->fWeights).super_TPZVec<std::complex<double>_>.fStore + lVar6;
      iVar2 = ppVar3[uVar9].second;
      lVar7 = (long)iVar2;
      if (((lVar6 < 0) ||
          ((this->fzi).super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow <= lVar6)) ||
         ((this->fzi).super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<std::complex<double>_>::Error
                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_58 = *(double *)pcVar8->_M_value;
      dStack_50 = *(double *)(pcVar8->_M_value + 8);
      std::complex<double>::operator*=((complex<double> *)&local_58,(this->fzi).fElem + lVar6);
      if (((iVar2 < 0) ||
          ((v2->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow <= lVar7)) ||
         ((v2->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol < 1)) {
        local_48 = local_58;
        dStack_40 = dStack_50;
        TPZFMatrix<std::complex<double>_>::Error
                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pcVar8 = v2->fElem + lVar7;
      dVar4 = *(double *)(pcVar8->_M_value + 8);
      pcVar1 = v2->fElem + lVar7;
      *(double *)pcVar1->_M_value = local_58 + *(double *)pcVar8->_M_value;
      *(double *)(pcVar1->_M_value + 8) = dStack_50 + dVar4;
      uVar9 = uVar9 + 1;
    } while ((uVar5 & 0x7fffffff) != uVar9);
  }
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::Contribute_v2(TPZFMatrix<TVar> &v2) {
	int i;
	SolveSystemZi();
#ifdef ZERO_INTERNAL_RESIDU
	for(i=0; i<fInternalEqs.NElements(); i++)
	{
		fzi(fInternalEqs[i],0) = 0.;
	}
#endif
	int neqs = fGlobalEqs.NElements();
	for (i=0;i<neqs;i++) 
	{
		std::pair<int,int> ind = fGlobalEqs[i];
		v2(ind.second,0) += fWeights[ind.first] * fzi(ind.first,0);
	}
}